

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.cpp
# Opt level: O1

void __thiscall
phaeton::ExpressionNode::ExpressionNode
          (ExpressionNode *this,ExprKind Kind,int NumChildren,ExprDims *ED)

{
  pointer *pppEVar1;
  iterator __position;
  int iVar2;
  ExpressionNode *local_30;
  
  this->_vptr_ExpressionNode = (_func_int **)&PTR__ExpressionNode_001625c8;
  this->ExKind = Kind;
  this->NumChildren = NumChildren;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Children).
  super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->Dims,ED);
  if (0 < this->NumChildren) {
    iVar2 = 0;
    do {
      local_30 = (ExpressionNode *)0x0;
      __position._M_current =
           (this->Children).
           super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->Children).
          super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<phaeton::ExpressionNode*,std::allocator<phaeton::ExpressionNode*>>::
        _M_realloc_insert<phaeton::ExpressionNode*>
                  ((vector<phaeton::ExpressionNode*,std::allocator<phaeton::ExpressionNode*>> *)
                   &this->Children,__position,&local_30);
      }
      else {
        *__position._M_current = (ExpressionNode *)0x0;
        pppEVar1 = &(this->Children).
                    super__Vector_base<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->NumChildren);
  }
  return;
}

Assistant:

ExpressionNode::ExpressionNode(ExprKind Kind, int NumChildren,
                               const ExprDims &ED)
    : ExKind(Kind), NumChildren(NumChildren), Dims(ED) {
  for (int I = 0; I < getNumChildren(); ++I) {
    Children.push_back(nullptr);
  }
}